

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

string * __thiscall
pfederc::LoopExpr::toString_abi_cxx11_(string *__return_storage_ptr__,LoopExpr *this)

{
  bool bVar1;
  ExprType EVar2;
  pointer this_00;
  pointer pEVar3;
  string local_100 [32];
  string local_e0 [32];
  string local_c0;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [39];
  undefined1 local_19;
  LoopExpr *local_18;
  LoopExpr *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (LoopExpr *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  EVar2 = Expr::getType(&this->super_Expr);
  if (EVar2 == EXPR_LOOP_DO) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"do");
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->initExpr);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,' ');
      pEVar3 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                         (&this->initExpr);
      (*pEVar3->_vptr_Expr[2])();
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_40);
      std::__cxx11::string::~string(local_40);
    }
  }
  else {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"for ");
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->initExpr);
    if (bVar1) {
      pEVar3 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                         (&this->initExpr);
      (*pEVar3->_vptr_Expr[2])();
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_60);
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"; ");
    }
    pEVar3 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                       (&this->condExpr);
    (*pEVar3->_vptr_Expr[2])();
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_80);
    std::__cxx11::string::~string(local_80);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->itExpr);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"; ");
      pEVar3 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                         (&this->itExpr);
      (*pEVar3->_vptr_Expr[2])();
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_a0);
      std::__cxx11::string::~string(local_a0);
    }
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
  this_00 = std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::operator->
                      (&this->bodyExpr);
  BodyExpr::toString_abi_cxx11_(&local_c0,this_00);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,';');
  EVar2 = Expr::getType(&this->super_Expr);
  if (EVar2 == EXPR_LOOP_DO) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," for ");
    pEVar3 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                       (&this->condExpr);
    (*pEVar3->_vptr_Expr[2])();
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_e0);
    std::__cxx11::string::~string(local_e0);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->itExpr);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"; ");
      pEVar3 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                         (&this->itExpr);
      (*pEVar3->_vptr_Expr[2])();
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_100);
      std::__cxx11::string::~string(local_100);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LoopExpr::toString() const noexcept {
  std::string result;
  if (getType() == ExprType::EXPR_LOOP_DO) {
    result += "do";
    if (initExpr) {
      result += ' ';
      result += initExpr->toString();
    }
  } else {
    result += "for ";
    if (initExpr) {
      result += initExpr->toString();
      result += "; ";
    }
    result += condExpr->toString();
    if (itExpr) {
      result += "; ";
      result += itExpr->toString();
    }
  }

  result += '\n';
  result += bodyExpr->toString();
  result += ';';

  if (getType() == ExprType::EXPR_LOOP_DO) {
    result += " for ";
    result += condExpr->toString();
    if (itExpr) {
      result += "; ";
      result += itExpr->toString();
    }
  }

  return result;
}